

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

size_type __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,size_type first_block
          )

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  bool bVar4;
  size_type i;
  undefined8 local_20;
  undefined8 local_8;
  
  local_20 = in_RSI;
  while( true ) {
    sVar2 = num_blocks((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1926c6);
    bVar4 = false;
    if (local_20 < sVar2) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI,local_20);
      bVar4 = *pvVar3 == 0;
    }
    if (!bVar4) break;
    local_20 = local_20 + 1;
  }
  sVar2 = num_blocks((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x192721);
  if (local_20 < sVar2) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_20);
    iVar1 = lowest_bit<unsigned_long>(0x19275d);
    local_8 = local_20 * 0x40 + (long)iVar1;
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

typename dynamic_bitset<Block, Allocator>::size_type
dynamic_bitset<Block, Allocator>::m_do_find_from(size_type first_block) const
{
    size_type i = first_block;

    // skip null blocks
    while (i < num_blocks() && m_bits[i] == 0)
        ++i;

    if (i >= num_blocks())
        return npos; // not found

    return i * bits_per_block + static_cast<size_type>(boost::lowest_bit(m_bits[i]));

}